

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  int iVar3;
  xmlRegExecCtxtPtr exec;
  xmlChar *arg1;
  xmlRelaxNGValidErr err;
  
  iVar3 = -1;
  if (elem == (xmlNodePtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  if (ctxt->elem == (xmlRegExecCtxtPtr)0x0) {
    if (((ctxt->schema == (xmlRelaxNGPtr)0x0) ||
        (pxVar1 = ctxt->schema->topgrammar, pxVar1 == (xmlRelaxNGGrammarPtr_conflict)0x0)) ||
       (pxVar2 = pxVar1->start, pxVar2 == (xmlRelaxNGDefinePtr_conflict)0x0)) {
      err = XML_RELAXNG_ERR_NOGRAMMAR;
      arg1 = (xmlChar *)0x0;
      goto LAB_0016f666;
    }
    if (pxVar2->contModel == (xmlRegexpPtr)0x0) {
      ctxt->pdef = pxVar2;
      return 0;
    }
    exec = xmlRegNewExecCtxt(pxVar2->contModel,xmlRelaxNGValidateProgressiveCallback,ctxt);
    if (exec == (xmlRegExecCtxtPtr)0x0) {
      return -1;
    }
    xmlRelaxNGElemPush(ctxt,exec);
  }
  ctxt->pnode = elem;
  ctxt->pstate = 0;
  if (elem->ns == (xmlNs *)0x0) {
    iVar3 = xmlRegExecPushString(ctxt->elem,elem->name,ctxt);
  }
  else {
    iVar3 = xmlRegExecPushString2(ctxt->elem,elem->name,elem->ns->href,ctxt);
  }
  if (-1 < iVar3) {
    if (ctxt->pstate == 0) {
      return 0;
    }
    return ctxt->pstate >> 0x1f | 1;
  }
  arg1 = elem->name;
  err = XML_RELAXNG_ERR_ELEMWRONG;
LAB_0016f666:
  xmlRelaxNGAddValidError(ctxt,err,arg1,(xmlChar *)0x0,0);
  return iVar3;
}

Assistant:

int
xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,
                              xmlDocPtr doc ATTRIBUTE_UNUSED,
                              xmlNodePtr elem)
{
    int ret = 1;

    if ((ctxt == NULL) || (elem == NULL))
        return (-1);

#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PushElem %s\n", elem->name);
#endif
    if (ctxt->elem == 0) {
        xmlRelaxNGPtr schema;
        xmlRelaxNGGrammarPtr grammar;
        xmlRegExecCtxtPtr exec;
        xmlRelaxNGDefinePtr define;

        schema = ctxt->schema;
        if (schema == NULL) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        grammar = schema->topgrammar;
        if ((grammar == NULL) || (grammar->start == NULL)) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        define = grammar->start;
        if (define->contModel == NULL) {
            ctxt->pdef = define;
            return (0);
        }
        exec = xmlRegNewExecCtxt(define->contModel,
                                 xmlRelaxNGValidateProgressiveCallback,
                                 ctxt);
        if (exec == NULL) {
            return (-1);
        }
        xmlRelaxNGElemPush(ctxt, exec);
    }
    ctxt->pnode = elem;
    ctxt->pstate = 0;
    if (elem->ns != NULL) {
        ret =
            xmlRegExecPushString2(ctxt->elem, elem->name, elem->ns->href,
                                  ctxt);
    } else {
        ret = xmlRegExecPushString(ctxt->elem, elem->name, ctxt);
    }
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMWRONG, elem->name);
    } else {
        if (ctxt->pstate == 0)
            ret = 0;
        else if (ctxt->pstate < 0)
            ret = -1;
        else
            ret = 1;
    }
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PushElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}